

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O1

int __thiscall deqp::gles2::Functional::CommonEdgeCase::init(CommonEdgeCase *this,EVP_PKEY_CTX *ctx)

{
  GLenum GVar1;
  int iVar2;
  InternalError *this_00;
  long *plVar3;
  size_type *psVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  int minViewportSize;
  int local_24c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [8];
  _func_int **local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_130 [264];
  
  MultisampleCase::init(&this->super_MultisampleCase,ctx);
  if ((this->m_caseType == CASETYPE_SMALL_QUADS) &&
     (local_24c = 0x20, (this->super_MultisampleCase).m_viewportSize < 0x20)) {
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    de::toString<int>(&local_208,&(this->super_MultisampleCase).m_viewportSize);
    std::operator+(&local_1e8,"Render target width or height too low (is ",&local_208);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    local_248._M_dataplus._M_p = (pointer)*plVar3;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)local_248._M_dataplus._M_p == psVar4) {
      local_248.field_2._M_allocated_capacity = *psVar4;
      local_248.field_2._8_8_ = plVar3[3];
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    }
    else {
      local_248.field_2._M_allocated_capacity = *psVar4;
    }
    local_248._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    de::toString<int>(&local_228,&local_24c);
    std::operator+(&local_1c8,&local_248,&local_228);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    local_1a8 = (undefined1  [8])*plVar3;
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar3 + 2);
    if (local_1a8 == (undefined1  [8])paVar5) {
      local_198[0]._0_8_ = paVar5->_M_allocated_capacity;
      local_198[0]._8_8_ = plVar3[3];
      local_1a8 = (undefined1  [8])local_198;
    }
    else {
      local_198[0]._0_8_ = paVar5->_M_allocated_capacity;
    }
    local_1a0 = (_func_int **)plVar3[1];
    *plVar3 = (long)paVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    tcu::InternalError::InternalError(this_00,(string *)local_1a8);
    __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  }
  glwEnable(0xbe2);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"glEnable(GL_BLEND)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x273);
  glwBlendEquation(0x8006);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"glBlendEquation(GL_FUNC_ADD)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x274);
  glwBlendFunc(1,1);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"glBlendFunc(GL_ONE, GL_ONE)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x275);
  local_1a8 = (undefined1  [8])
              ((this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
              ->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a0,
             "Additive blending enabled in order to detect (erroneously) overlapping samples",0x4e);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  iVar2 = std::ios_base::~ios_base(local_130);
  return iVar2;
}

Assistant:

void CommonEdgeCase::init (void)
{
	MultisampleCase::init();

	if (m_caseType == CASETYPE_SMALL_QUADS)
	{
		// Check for a big enough viewport. With too small viewports the test case can't analyze the resulting image well enough.

		const int minViewportSize = 32;

		DE_ASSERT(minViewportSize <= getDesiredViewportSize());

		if (m_viewportSize < minViewportSize)
			throw tcu::InternalError("Render target width or height too low (is " + de::toString(m_viewportSize) + ", should be at least " + de::toString(minViewportSize) + ")");
	}

	GLU_CHECK_CALL(glEnable(GL_BLEND));
	GLU_CHECK_CALL(glBlendEquation(GL_FUNC_ADD));
	GLU_CHECK_CALL(glBlendFunc(GL_ONE, GL_ONE));

	m_testCtx.getLog() << TestLog::Message << "Additive blending enabled in order to detect (erroneously) overlapping samples" << TestLog::EndMessage;
}